

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<BLOCK_SIZE> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<BLOCK_SIZE> PVar1;
  _Vector_base<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_> _Stack_28;
  
  ValueArray<BLOCK_SIZE,BLOCK_SIZE,BLOCK_SIZE,BLOCK_SIZE>::MakeVector<BLOCK_SIZE,0ul,1ul,2ul,3ul>
            (&_Stack_28);
  ValuesIn<std::vector<BLOCK_SIZE,std::allocator<BLOCK_SIZE>>>
            ((testing *)this,(vector<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_> *)&_Stack_28);
  std::_Vector_base<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_>::~_Vector_base(&_Stack_28);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<BLOCK_SIZE>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }